

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyConstraintSolver.cpp
# Opt level: O0

void __thiscall
btMultiBodyConstraintSolver::convertMultiBodyContact
          (btMultiBodyConstraintSolver *this,btPersistentManifold *manifold,
          btContactSolverInfo *infoGlobal)

{
  int iVar1;
  btMultiBodyLinkCollider *pbVar2;
  btMultiBodyLinkCollider *pbVar3;
  btManifoldPoint *this_00;
  btCollisionObject *colObj;
  btAlignedObjectArray<btMultiBodySolverConstraint> *in_RDX;
  btPersistentManifold *in_RSI;
  btCollisionObject *in_RDI;
  btScalar bVar4;
  btScalar bVar5;
  btManifoldPoint *unaff_retaddr;
  int in_stack_0000000c;
  btPersistentManifold *in_stack_00000010;
  btVector3 *in_stack_00000018;
  btMultiBodyConstraintSolver *in_stack_00000020;
  btCollisionObject *in_stack_00000030;
  btContactSolverInfo *in_stack_00000038;
  bool isFriction;
  btMultiBodySolverConstraint *solverConstraint;
  int frictionIndex;
  btScalar relaxation;
  btManifoldPoint *cp;
  int j;
  int solverBodyIdB;
  int solverBodyIdA;
  btCollisionObject *colObj1;
  btCollisionObject *colObj0;
  btMultiBody *mbB;
  btMultiBody *mbA;
  btMultiBodyLinkCollider *fcB;
  btMultiBodyLinkCollider *fcA;
  btScalar in_stack_0000016c;
  btCollisionObject *in_stack_00000170;
  btSequentialImpulseConstraintSolver *in_stack_00000178;
  btScalar in_stack_0000081c;
  btScalar in_stack_00000820;
  undefined1 in_stack_00000827;
  btScalar *in_stack_00000828;
  btContactSolverInfo *in_stack_00000830;
  btManifoldPoint *in_stack_00000838;
  btVector3 *in_stack_00000840;
  btMultiBodySolverConstraint *in_stack_00000848;
  btMultiBodyConstraintSolver *in_stack_00000850;
  btCollisionObject *in_stack_ffffffffffffff48;
  btAlignedObjectArray<btMultiBodySolverConstraint> *in_stack_ffffffffffffff50;
  btAlignedObjectArray<btMultiBodySolverConstraint> *pbVar6;
  btScalar local_98;
  btScalar local_94;
  btMultiBody *local_90;
  btMultiBody *local_88;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 uVar7;
  undefined4 in_stack_ffffffffffffffa8;
  int iVar8;
  int index;
  btCollisionObject *colObj0_00;
  
  colObj0_00 = in_RDI;
  btPersistentManifold::getBody0(in_RSI);
  pbVar2 = btMultiBodyLinkCollider::upcast(in_stack_ffffffffffffff48);
  btPersistentManifold::getBody1(in_RSI);
  pbVar3 = btMultiBodyLinkCollider::upcast(in_stack_ffffffffffffff48);
  if (pbVar2 == (btMultiBodyLinkCollider *)0x0) {
    local_88 = (btMultiBody *)0x0;
  }
  else {
    local_88 = *(btMultiBody **)(pbVar2 + 0x150);
  }
  if (pbVar3 == (btMultiBodyLinkCollider *)0x0) {
    local_90 = (btMultiBody *)0x0;
  }
  else {
    local_90 = *(btMultiBody **)(pbVar3 + 0x150);
  }
  btPersistentManifold::getBody0(in_RSI);
  btPersistentManifold::getBody1(in_RSI);
  if (local_88 == (btMultiBody *)0x0) {
    local_94 = (btScalar)
               btSequentialImpulseConstraintSolver::getOrInitSolverBody
                         (in_stack_00000178,in_stack_00000170,in_stack_0000016c);
  }
  else {
    local_94 = -NAN;
  }
  if (local_90 == (btMultiBody *)0x0) {
    local_98 = (btScalar)
               btSequentialImpulseConstraintSolver::getOrInitSolverBody
                         (in_stack_00000178,in_stack_00000170,in_stack_0000016c);
  }
  else {
    local_98 = -NAN;
  }
  iVar8 = 0;
  while (index = iVar8, iVar1 = btPersistentManifold::getNumContacts(in_RSI), iVar8 < iVar1) {
    this_00 = btPersistentManifold::getContactPoint(in_RSI,index);
    bVar4 = btManifoldPoint::getDistance(this_00);
    bVar5 = btPersistentManifold::getContactProcessingThreshold(in_RSI);
    if (bVar4 <= bVar5) {
      iVar8 = btAlignedObjectArray<btMultiBodySolverConstraint>::size
                        ((btAlignedObjectArray<btMultiBodySolverConstraint> *)
                         (in_RDI[1].m_worldTransform.m_basis.m_el + 1));
      colObj = (btCollisionObject *)
               btAlignedObjectArray<btMultiBodySolverConstraint>::expandNonInitializing
                         (in_stack_ffffffffffffff50);
      colObj->m_extensionPointer = (btMultiBodyConstraint *)0x0;
      *(int *)&colObj->m_rootCollisionShape = -1;
      (colObj->m_anisotropicFriction).m_floats[0] = local_94;
      colObj->m_contactProcessingThreshold = local_98;
      *(btMultiBody **)((colObj->m_anisotropicFriction).m_floats + 2) = local_88;
      if (local_88 != (btMultiBody *)0x0) {
        colObj->m_hasAnisotropicFriction = *(int *)(pbVar2 + 0x158);
      }
      colObj->m_broadphaseHandle = (btBroadphaseProxy *)local_90;
      if (local_90 != (btMultiBody *)0x0) {
        *(int *)&colObj->m_collisionShape = *(int *)(pbVar3 + 0x158);
      }
      ((anon_union_8_2_e8b08339_for_btMultiBodySolverConstraint_19 *)
      &colObj->m_interpolationAngularVelocity)->m_originalContactPoint = this_00;
      uVar7 = 0;
      setupMultiBodyContactConstraint
                (in_stack_00000850,in_stack_00000848,in_stack_00000840,in_stack_00000838,
                 in_stack_00000830,in_stack_00000828,(bool)in_stack_00000827,in_stack_00000820,
                 in_stack_0000081c);
      *(int *)((long)&colObj->m_interpolationAngularVelocity + 0xc) = iVar8;
      if (((*(uint *)(in_RDX + 0x40) & 0x20) == 0) ||
         ((this_00->m_lateralFrictionInitialized & 1U) == 0)) {
        btPlaneSpace1<btVector3>
                  ((btVector3 *)CONCAT44(local_94,local_98),
                   (btVector3 *)CONCAT44(index,in_stack_ffffffffffffffa8),&this_00->m_localPointA);
        btSequentialImpulseConstraintSolver::applyAnisotropicFriction
                  (colObj,(btVector3 *)CONCAT17(uVar7,in_stack_ffffffffffffff88),
                   (int)((ulong)in_RDI >> 0x20));
        in_stack_ffffffffffffff50 = in_RDX;
        btSequentialImpulseConstraintSolver::applyAnisotropicFriction
                  (colObj,(btVector3 *)CONCAT17(uVar7,in_stack_ffffffffffffff88),
                   (int)((ulong)in_RDI >> 0x20));
        in_RDX = in_stack_ffffffffffffff50;
        addMultiBodyFrictionConstraint
                  (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_0000000c,
                   unaff_retaddr,colObj0_00,in_stack_00000030,(btScalar)((ulong)in_RSI >> 0x20),
                   in_stack_00000038,SUB84(in_RSI,0),
                   (btScalar)((ulong)in_stack_ffffffffffffff50 >> 0x20));
        if ((*(uint *)(in_RDX + 0x40) & 0x10) != 0) {
          btSequentialImpulseConstraintSolver::applyAnisotropicFriction
                    (colObj,(btVector3 *)CONCAT17(uVar7,in_stack_ffffffffffffff88),
                     (int)((ulong)in_RDI >> 0x20));
          in_stack_ffffffffffffff50 = in_RDX;
          btSequentialImpulseConstraintSolver::applyAnisotropicFriction
                    (colObj,(btVector3 *)CONCAT17(uVar7,in_stack_ffffffffffffff88),
                     (int)((ulong)in_RDI >> 0x20));
          in_RDX = in_stack_ffffffffffffff50;
          addMultiBodyFrictionConstraint
                    (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_0000000c,
                     unaff_retaddr,colObj0_00,in_stack_00000030,(btScalar)((ulong)in_RSI >> 0x20),
                     in_stack_00000038,SUB84(in_RSI,0),
                     (btScalar)((ulong)in_stack_ffffffffffffff50 >> 0x20));
        }
        if (((*(uint *)(in_RDX + 0x40) & 0x10) != 0) && ((*(uint *)(in_RDX + 0x40) & 0x40) != 0)) {
          this_00->m_lateralFrictionInitialized = true;
        }
      }
      else {
        pbVar6 = in_RDX;
        addMultiBodyFrictionConstraint
                  (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_0000000c,
                   unaff_retaddr,colObj0_00,in_stack_00000030,(btScalar)((ulong)in_RSI >> 0x20),
                   in_stack_00000038,SUB84(in_RSI,0),(btScalar)((ulong)in_RDX >> 0x20));
        in_stack_ffffffffffffff50 = in_RDX;
        in_RDX = pbVar6;
        if ((*(uint *)(pbVar6 + 0x40) & 0x10) != 0) {
          addMultiBodyFrictionConstraint
                    (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_0000000c,
                     unaff_retaddr,colObj0_00,in_stack_00000030,(btScalar)((ulong)in_RSI >> 0x20),
                     in_stack_00000038,SUB84(in_RSI,0),(btScalar)((ulong)pbVar6 >> 0x20));
          in_stack_ffffffffffffff50 = pbVar6;
        }
        (colObj->m_interpolationWorldTransform).m_basis.m_el[2].m_floats[3] = 0.0;
        (colObj->m_interpolationWorldTransform).m_basis.m_el[2].m_floats[2] = 0.0;
      }
    }
    iVar8 = index + 1;
  }
  return;
}

Assistant:

void	btMultiBodyConstraintSolver::convertMultiBodyContact(btPersistentManifold* manifold,const btContactSolverInfo& infoGlobal)
{
	const btMultiBodyLinkCollider* fcA = btMultiBodyLinkCollider::upcast(manifold->getBody0());
	const btMultiBodyLinkCollider* fcB = btMultiBodyLinkCollider::upcast(manifold->getBody1());
	
	btMultiBody* mbA = fcA? fcA->m_multiBody : 0;
	btMultiBody* mbB = fcB? fcB->m_multiBody : 0;

	btCollisionObject* colObj0=0,*colObj1=0;

	colObj0 = (btCollisionObject*)manifold->getBody0();
	colObj1 = (btCollisionObject*)manifold->getBody1();

	int solverBodyIdA = mbA? -1 : getOrInitSolverBody(*colObj0,infoGlobal.m_timeStep);
	int solverBodyIdB = mbB ? -1 : getOrInitSolverBody(*colObj1,infoGlobal.m_timeStep);

//	btSolverBody* solverBodyA = mbA ? 0 : &m_tmpSolverBodyPool[solverBodyIdA];
//	btSolverBody* solverBodyB = mbB ? 0 : &m_tmpSolverBodyPool[solverBodyIdB];


	///avoid collision response between two static objects
//	if (!solverBodyA || (solverBodyA->m_invMass.isZero() && (!solverBodyB || solverBodyB->m_invMass.isZero())))
	//	return;



	for (int j=0;j<manifold->getNumContacts();j++)
	{

		btManifoldPoint& cp = manifold->getContactPoint(j);

		if (cp.getDistance() <= manifold->getContactProcessingThreshold())
		{
		
			btScalar relaxation;

			int frictionIndex = m_multiBodyNormalContactConstraints.size();

			btMultiBodySolverConstraint& solverConstraint = m_multiBodyNormalContactConstraints.expandNonInitializing();

	//		btRigidBody* rb0 = btRigidBody::upcast(colObj0);
	//		btRigidBody* rb1 = btRigidBody::upcast(colObj1);
            solverConstraint.m_orgConstraint = 0;
            solverConstraint.m_orgDofIndex = -1;
			solverConstraint.m_solverBodyIdA = solverBodyIdA;
			solverConstraint.m_solverBodyIdB = solverBodyIdB;
			solverConstraint.m_multiBodyA = mbA;
			if (mbA)
				solverConstraint.m_linkA = fcA->m_link;

			solverConstraint.m_multiBodyB = mbB;
			if (mbB)
				solverConstraint.m_linkB = fcB->m_link;

			solverConstraint.m_originalContactPoint = &cp;

			bool isFriction = false;
			setupMultiBodyContactConstraint(solverConstraint, cp.m_normalWorldOnB,cp, infoGlobal, relaxation, isFriction);

//			const btVector3& pos1 = cp.getPositionWorldOnA();
//			const btVector3& pos2 = cp.getPositionWorldOnB();

			/////setup the friction constraints
#define ENABLE_FRICTION
#ifdef ENABLE_FRICTION
			solverConstraint.m_frictionIndex = frictionIndex;
#if ROLLING_FRICTION
	int rollingFriction=1;
			btVector3 angVelA(0,0,0),angVelB(0,0,0);
			if (rb0)
				angVelA = rb0->getAngularVelocity();
			if (rb1)
				angVelB = rb1->getAngularVelocity();
			btVector3 relAngVel = angVelB-angVelA;

			if ((cp.m_combinedRollingFriction>0.f) && (rollingFriction>0))
			{
				//only a single rollingFriction per manifold
				rollingFriction--;
				if (relAngVel.length()>infoGlobal.m_singleAxisRollingFrictionThreshold)
				{
					relAngVel.normalize();
					applyAnisotropicFriction(colObj0,relAngVel,btCollisionObject::CF_ANISOTROPIC_ROLLING_FRICTION);
					applyAnisotropicFriction(colObj1,relAngVel,btCollisionObject::CF_ANISOTROPIC_ROLLING_FRICTION);
					if (relAngVel.length()>0.001)
						addRollingFrictionConstraint(relAngVel,solverBodyIdA,solverBodyIdB,frictionIndex,cp,rel_pos1,rel_pos2,colObj0,colObj1, relaxation);

				} else
				{
					addRollingFrictionConstraint(cp.m_normalWorldOnB,solverBodyIdA,solverBodyIdB,frictionIndex,cp,rel_pos1,rel_pos2,colObj0,colObj1, relaxation);
					btVector3 axis0,axis1;
					btPlaneSpace1(cp.m_normalWorldOnB,axis0,axis1);
					applyAnisotropicFriction(colObj0,axis0,btCollisionObject::CF_ANISOTROPIC_ROLLING_FRICTION);
					applyAnisotropicFriction(colObj1,axis0,btCollisionObject::CF_ANISOTROPIC_ROLLING_FRICTION);
					applyAnisotropicFriction(colObj0,axis1,btCollisionObject::CF_ANISOTROPIC_ROLLING_FRICTION);
					applyAnisotropicFriction(colObj1,axis1,btCollisionObject::CF_ANISOTROPIC_ROLLING_FRICTION);
					if (axis0.length()>0.001)
						addRollingFrictionConstraint(axis0,solverBodyIdA,solverBodyIdB,frictionIndex,cp,rel_pos1,rel_pos2,colObj0,colObj1, relaxation);
					if (axis1.length()>0.001)
						addRollingFrictionConstraint(axis1,solverBodyIdA,solverBodyIdB,frictionIndex,cp,rel_pos1,rel_pos2,colObj0,colObj1, relaxation);
		
				}
			}
#endif //ROLLING_FRICTION

			///Bullet has several options to set the friction directions
			///By default, each contact has only a single friction direction that is recomputed automatically very frame 
			///based on the relative linear velocity.
			///If the relative velocity it zero, it will automatically compute a friction direction.
			
			///You can also enable two friction directions, using the SOLVER_USE_2_FRICTION_DIRECTIONS.
			///In that case, the second friction direction will be orthogonal to both contact normal and first friction direction.
			///
			///If you choose SOLVER_DISABLE_VELOCITY_DEPENDENT_FRICTION_DIRECTION, then the friction will be independent from the relative projected velocity.
			///
			///The user can manually override the friction directions for certain contacts using a contact callback, 
			///and set the cp.m_lateralFrictionInitialized to true
			///In that case, you can set the target relative motion in each friction direction (cp.m_contactMotion1 and cp.m_contactMotion2)
			///this will give a conveyor belt effect
			///
			if (!(infoGlobal.m_solverMode & SOLVER_ENABLE_FRICTION_DIRECTION_CACHING) || !cp.m_lateralFrictionInitialized)
			{/*
				cp.m_lateralFrictionDir1 = vel - cp.m_normalWorldOnB * rel_vel;
				btScalar lat_rel_vel = cp.m_lateralFrictionDir1.length2();
				if (!(infoGlobal.m_solverMode & SOLVER_DISABLE_VELOCITY_DEPENDENT_FRICTION_DIRECTION) && lat_rel_vel > SIMD_EPSILON)
				{
					cp.m_lateralFrictionDir1 *= 1.f/btSqrt(lat_rel_vel);
					if((infoGlobal.m_solverMode & SOLVER_USE_2_FRICTION_DIRECTIONS))
					{
						cp.m_lateralFrictionDir2 = cp.m_lateralFrictionDir1.cross(cp.m_normalWorldOnB);
						cp.m_lateralFrictionDir2.normalize();//??
						applyAnisotropicFriction(colObj0,cp.m_lateralFrictionDir2,btCollisionObject::CF_ANISOTROPIC_FRICTION);
						applyAnisotropicFriction(colObj1,cp.m_lateralFrictionDir2,btCollisionObject::CF_ANISOTROPIC_FRICTION);
						addMultiBodyFrictionConstraint(cp.m_lateralFrictionDir2,solverBodyIdA,solverBodyIdB,frictionIndex,cp,rel_pos1,rel_pos2,colObj0,colObj1, relaxation);

					}

					applyAnisotropicFriction(colObj0,cp.m_lateralFrictionDir1,btCollisionObject::CF_ANISOTROPIC_FRICTION);
					applyAnisotropicFriction(colObj1,cp.m_lateralFrictionDir1,btCollisionObject::CF_ANISOTROPIC_FRICTION);
					addMultiBodyFrictionConstraint(cp.m_lateralFrictionDir1,solverBodyIdA,solverBodyIdB,frictionIndex,cp,rel_pos1,rel_pos2,colObj0,colObj1, relaxation);

				} else
				*/
				{
					btPlaneSpace1(cp.m_normalWorldOnB,cp.m_lateralFrictionDir1,cp.m_lateralFrictionDir2);

					applyAnisotropicFriction(colObj0,cp.m_lateralFrictionDir1,btCollisionObject::CF_ANISOTROPIC_FRICTION);
					applyAnisotropicFriction(colObj1,cp.m_lateralFrictionDir1,btCollisionObject::CF_ANISOTROPIC_FRICTION);
					addMultiBodyFrictionConstraint(cp.m_lateralFrictionDir1,manifold,frictionIndex,cp,colObj0,colObj1, relaxation,infoGlobal);

					if ((infoGlobal.m_solverMode & SOLVER_USE_2_FRICTION_DIRECTIONS))
					{
						applyAnisotropicFriction(colObj0,cp.m_lateralFrictionDir2,btCollisionObject::CF_ANISOTROPIC_FRICTION);
						applyAnisotropicFriction(colObj1,cp.m_lateralFrictionDir2,btCollisionObject::CF_ANISOTROPIC_FRICTION);
						addMultiBodyFrictionConstraint(cp.m_lateralFrictionDir2,manifold,frictionIndex,cp,colObj0,colObj1, relaxation,infoGlobal);
					}

					if ((infoGlobal.m_solverMode & SOLVER_USE_2_FRICTION_DIRECTIONS) && (infoGlobal.m_solverMode & SOLVER_DISABLE_VELOCITY_DEPENDENT_FRICTION_DIRECTION))
					{
						cp.m_lateralFrictionInitialized = true;
					}
				}

			} else
			{
				addMultiBodyFrictionConstraint(cp.m_lateralFrictionDir1,manifold,frictionIndex,cp,colObj0,colObj1, relaxation,infoGlobal,cp.m_contactMotion1, cp.m_contactCFM1);

				if ((infoGlobal.m_solverMode & SOLVER_USE_2_FRICTION_DIRECTIONS))
					addMultiBodyFrictionConstraint(cp.m_lateralFrictionDir2,manifold,frictionIndex,cp,colObj0,colObj1, relaxation, infoGlobal,cp.m_contactMotion2, cp.m_contactCFM2);

				//setMultiBodyFrictionConstraintImpulse( solverConstraint, solverBodyIdA, solverBodyIdB, cp, infoGlobal);
				//todo:
				solverConstraint.m_appliedImpulse = 0.f;
				solverConstraint.m_appliedPushImpulse = 0.f;
			}
		

#endif //ENABLE_FRICTION

		}
	}
}